

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::equalityRowAddition<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt addedEqRow,double eqRowScale,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  undefined8 in_RCX;
  int in_EDX;
  int __c;
  int in_ESI;
  iterator *rhs;
  HighsDataStack *in_RDI;
  HighsSliceNonzero *rowVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletPositionSlice> *__range2;
  HighsMatrixSlice<HighsTripletPositionSlice> *in_stack_ffffffffffffff50;
  HighsDataStack *in_stack_ffffffffffffff58;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff60;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff68;
  iterator local_68;
  iterator local_48;
  undefined8 local_28;
  undefined8 local_20;
  int local_10;
  int local_c;
  
  local_20 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x742fa7);
  local_28 = local_20;
  HighsMatrixSlice<HighsTripletPositionSlice>::begin(in_stack_ffffffffffffff50);
  HighsMatrixSlice<HighsTripletPositionSlice>::end(in_stack_ffffffffffffff50);
  while( true ) {
    rhs = &local_68;
    bVar1 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator!=(&local_48,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator*(&local_48);
    in_stack_ffffffffffffff60 =
         (HighsPostsolveStack *)
         &in_RDI[5].data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
    in_stack_ffffffffffffff58 = in_RDI + 3;
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff68 =
         (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *)std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff58,
                       (long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,
               (double *)in_stack_ffffffffffffff50);
    HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator++(&local_48);
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)&in_RDI[3].position,(long)local_c);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)&in_RDI[3].position,(long)local_10);
  HighsDataStack::push<presolve::HighsPostsolveStack::EqualityRowAddition,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff60,
             (EqualityRowAddition *)in_stack_ffffffffffffff58);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(in_RDI,in_stack_ffffffffffffff68);
  reductionAdded(in_stack_ffffffffffffff60,type);
  return;
}

Assistant:

void equalityRowAddition(HighsInt row, HighsInt addedEqRow, double eqRowScale,
                           const HighsMatrixSlice<RowStorageFormat>& eqRowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAddition{
        origRowIndex[row], origRowIndex[addedEqRow], eqRowScale});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kEqualityRowAddition);
  }